

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5f699::CtorEvalExternalInterface::importGlobals
          (CtorEvalExternalInterface *this,GlobalValueSet *globals,Module *wasm_)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  Name *other;
  Global *__k;
  bool bVar3;
  _Base_ptr p_Var4;
  long lVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  string *psVar8;
  long *plVar9;
  size_type *psVar10;
  key_type *__k_00;
  pointer puVar11;
  _Base_ptr p_Var12;
  Name NVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  pointer local_d0;
  GlobalValueSet *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  CtorEvalExternalInterface *local_60;
  Global *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar11 = (wasm_->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_d0 = (wasm_->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar11 != local_d0) {
    p_Var1 = &(this->linkedInstances)._M_t._M_impl.super__Rb_tree_header;
    local_c8 = globals;
    local_60 = this;
    do {
      local_58 = (puVar11->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(local_58->super_Importable).module + 8) != (char *)0x0) {
        other = &(local_58->super_Importable).module;
        p_Var4 = (local_60->linkedInstances)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var12 = &p_Var1->_M_header;
        for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[bVar3]) {
          bVar3 = wasm::IString::operator<((IString *)(p_Var4 + 1),&other->super_IString);
          if (!bVar3) {
            p_Var12 = p_Var4;
          }
        }
        p_Var4 = &p_Var1->_M_header;
        if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
           (bVar3 = wasm::IString::operator<(&other->super_IString,(IString *)(p_Var12 + 1)),
           p_Var4 = p_Var12, bVar3)) {
          p_Var4 = &p_Var1->_M_header;
        }
        __k = local_58;
        if ((_Rb_tree_header *)p_Var4 == p_Var1) {
          psVar8 = (string *)__cxa_allocate_exception(0x20);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          local_f0.field_2._M_allocated_capacity._0_7_ = 0x4774726f706d69;
          local_f0.field_2._M_local_buf[7] = 'l';
          local_f0.field_2._8_7_ = 0x203a736c61626f;
          local_f0._M_string_length = 0xf;
          local_f0.field_2._M_local_buf[0xf] = '\0';
          pcVar2 = (__k->super_Importable).module.super_IString.str._M_str;
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,pcVar2,
                     pcVar2 + (__k->super_Importable).module.super_IString.str._M_len);
          std::operator+(&local_110,&local_f0,&local_a0);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_110);
          local_50._M_dataplus._M_p = (pointer)*plVar9;
          psVar10 = (size_type *)(plVar9 + 2);
          if ((size_type *)local_50._M_dataplus._M_p == psVar10) {
            local_50.field_2._M_allocated_capacity = *psVar10;
            local_50.field_2._8_4_ = (undefined4)plVar9[3];
            local_50.field_2._12_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          }
          else {
            local_50.field_2._M_allocated_capacity = *psVar10;
          }
          local_50._M_string_length = plVar9[1];
          *plVar9 = (long)psVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          pcVar2 = (local_58->super_Importable).base.super_IString.str._M_str;
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,pcVar2,
                     pcVar2 + (local_58->super_Importable).base.super_IString.str._M_len);
          std::operator+(&local_c0,&local_50,&local_80);
          *(string **)psVar8 = psVar8 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    (psVar8,local_c0._M_dataplus._M_p,
                     local_c0._M_dataplus._M_p + local_c0._M_string_length);
          __cxa_throw(psVar8,&(anonymous_namespace)::FailToEvalException::typeinfo,
                      FailToEvalException::~FailToEvalException);
        }
        p_Var4 = p_Var4[1]._M_left;
        NVar13.super_IString.str._M_str =
             (char *)(local_58->super_Importable).base.super_IString.str._M_len;
        NVar13.super_IString.str._M_len = *(size_t *)(p_Var4 + 1);
        lVar5 = wasm::Module::getExportOrNull(NVar13);
        if ((lVar5 == 0) || (*(int *)(lVar5 + 0x10) != 3)) {
          psVar8 = (string *)__cxa_allocate_exception(0x20);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          local_f0.field_2._M_allocated_capacity._0_7_ = 0x4774726f706d69;
          local_f0.field_2._M_local_buf[7] = 'l';
          local_f0.field_2._8_7_ = 0x203a736c61626f;
          local_f0._M_string_length = 0xf;
          local_f0.field_2._M_local_buf[0xf] = '\0';
          pcVar2 = (__k->super_Importable).module.super_IString.str._M_str;
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,pcVar2,
                     pcVar2 + (__k->super_Importable).module.super_IString.str._M_len);
          std::operator+(&local_110,&local_f0,&local_a0);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_110);
          local_50._M_dataplus._M_p = (pointer)*plVar9;
          psVar10 = (size_type *)(plVar9 + 2);
          if ((size_type *)local_50._M_dataplus._M_p == psVar10) {
            local_50.field_2._M_allocated_capacity = *psVar10;
            local_50.field_2._8_4_ = (undefined4)plVar9[3];
            local_50.field_2._12_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          }
          else {
            local_50.field_2._M_allocated_capacity = *psVar10;
          }
          local_50._M_string_length = plVar9[1];
          *plVar9 = (long)psVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          pcVar2 = (local_58->super_Importable).base.super_IString.str._M_str;
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,pcVar2,
                     pcVar2 + (local_58->super_Importable).base.super_IString.str._M_len);
          std::operator+(&local_c0,&local_50,&local_80);
          *(string **)psVar8 = psVar8 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    (psVar8,local_c0._M_dataplus._M_p,
                     local_c0._M_dataplus._M_p + local_c0._M_string_length);
          __cxa_throw(psVar8,&(anonymous_namespace)::FailToEvalException::typeinfo,
                      FailToEvalException::~FailToEvalException);
        }
        __k_00 = (key_type *)(lVar5 + 0x18);
        if (*(char *)(lVar5 + 0x28) != '\0') {
          __k_00 = (key_type *)0x0;
        }
        pmVar6 = std::
                 map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                 ::operator[]((map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                               *)&p_Var4[1]._M_parent,__k_00);
        pmVar7 = std::
                 map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                 ::operator[](local_c8,(key_type *)__k);
        (pmVar7->super_SmallVector<wasm::Literal,_1UL>).usedFixed =
             (pmVar6->super_SmallVector<wasm::Literal,_1UL>).usedFixed;
        wasm::Literal::operator=
                  ((pmVar7->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,
                   (pmVar6->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::operator=
                  (&(pmVar7->super_SmallVector<wasm::Literal,_1UL>).flexible,
                   &(pmVar6->super_SmallVector<wasm::Literal,_1UL>).flexible);
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 != local_d0);
  }
  return;
}

Assistant:

void importGlobals(GlobalValueSet& globals, Module& wasm_) override {
    ModuleUtils::iterImportedGlobals(wasm_, [&](Global* global) {
      auto it = linkedInstances.find(global->module);
      if (it != linkedInstances.end()) {
        auto* inst = it->second.get();
        auto* globalExport = inst->wasm.getExportOrNull(global->base);
        if (!globalExport || globalExport->kind != ExternalKind::Global) {
          throw FailToEvalException(std::string("importGlobals: ") +
                                    global->module.toString() + "." +
                                    global->base.toString());
        }
        globals[global->name] = inst->globals[*globalExport->getInternalName()];
      } else {
        throw FailToEvalException(std::string("importGlobals: ") +
                                  global->module.toString() + "." +
                                  global->base.toString());
      }
    });
  }